

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

uint32 __thiscall rw::gl3::getLevelSize(gl3 *this,Raster *raster,int32 level)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *(uint *)(this + 0x40);
  uVar4 = *(uint *)(this + 0x44);
  iVar1 = *(int *)(this + 0x48);
  uVar3 = 0;
  if (0 < (int)raster) {
    uVar3 = (ulong)raster & 0xffffffff;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    if (1 < (int)uVar5) {
      uVar5 = uVar5 >> 1;
      iVar1 = iVar1 / 2;
    }
    uVar4 = uVar4 >> (1 < (int)uVar4);
  }
  return iVar1 * uVar4;
}

Assistant:

static uint32
getLevelSize(Raster *raster, int32 level)
{
	int i;
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	int w = raster->originalWidth;
	int h = raster->originalHeight;
	int s = raster->originalStride;
	int minDim = 1;

#ifdef RW_OPENGL
	switch(natras->internalFormat){
	case GL_COMPRESSED_RGBA_S3TC_DXT1_EXT:
	case GL_COMPRESSED_RGB_S3TC_DXT1_EXT:
	case GL_COMPRESSED_RGBA_S3TC_DXT3_EXT:
	case GL_COMPRESSED_RGBA_S3TC_DXT5_EXT:
		minDim = 4;
		break;
	}
#endif

	for(i = 0; i < level; i++){
		if(w > minDim){
			w /= 2;
			s /= 2;
		}
		if(h > minDim)
			h /= 2;
	}

	return s*h;
}